

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall dg::llvmdg::legacy::GraphBuilder::~GraphBuilder(GraphBuilder *this)

{
  bool bVar1;
  iterator this_00;
  reference ppVar2;
  long in_RDI;
  pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*> function;
  iterator __end2;
  iterator __begin2;
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  *__range2;
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  *in_stack_ffffffffffffffb8;
  Function *this_01;
  _Self local_18;
  long local_10;
  
  local_10 = in_RDI + 0x10;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  this_00 = std::
            map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
            ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,(_Self *)&stack0xffffffffffffffe0);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                          *)0x21c569);
    this_01 = ppVar2->second;
    if (this_01 != (Function *)0x0) {
      Function::~Function((Function *)this_00._M_node);
      operator_delete(this_01,0x40);
    }
    std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                  *)this_01);
  }
  std::
  unordered_map<const_llvm::BasicBlock_*,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>_>
  ::~unordered_map((unordered_map<const_llvm::BasicBlock_*,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>_>
                    *)0x21c5bf);
  std::
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  ::~map((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
          *)0x21c5cd);
  return;
}

Assistant:

GraphBuilder::~GraphBuilder() {
    for (auto function : _functions) {
        delete function.second;
    }
}